

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

void __thiscall
s2shapeutil::VectorShapeFactory::VectorShapeFactory
          (VectorShapeFactory *this,
          vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
          *shapes)

{
  (this->super_ShapeFactory)._vptr_ShapeFactory = (_func_int **)&PTR__VectorShapeFactory_00306170;
  std::
  make_shared<std::vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>,std::vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>>
            ((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              *)&this->shared_shapes_);
  return;
}

Assistant:

VectorShapeFactory::VectorShapeFactory(vector<unique_ptr<S2Shape>> shapes)
    : shared_shapes_(
          make_shared<vector<unique_ptr<S2Shape>>>(std::move(shapes))) {
}